

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

scm_type __thiscall
skiwi::make_list(skiwi *this,vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_> *lst)

{
  bool bVar1;
  reference psVar2;
  scm_type local_68;
  scm_type local_60;
  scm_type local_58 [3];
  scm_type local_40;
  scm_type local_38;
  undefined1 local_29;
  undefined1 local_28 [8];
  const_reverse_iterator it_end;
  const_reverse_iterator it;
  vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_> *lst_local;
  scm_type *out;
  
  bVar1 = std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>::empty(lst);
  if (bVar1) {
    make_nil();
  }
  else {
    std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>::rbegin
              ((vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_> *)&it_end);
    std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>::rend
              ((vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_> *)local_28);
    local_29 = 0;
    psVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_skiwi::scm_type_*,_std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_skiwi::scm_type_*,_std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>_>_>
                          *)&it_end);
    local_38.scm_value = psVar2->scm_value;
    make_nil();
    make_pair(this,&local_38,&local_40);
    scm_type::~scm_type(&local_40);
    scm_type::~scm_type(&local_38);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_skiwi::scm_type_*,_std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>_>_>
    ::operator++(&it_end);
    while (bVar1 = std::operator!=(&it_end,(reverse_iterator<__gnu_cxx::__normal_iterator<const_skiwi::scm_type_*,_std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>_>_>
                                            *)local_28), bVar1) {
      psVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_skiwi::scm_type_*,_std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>_>_>
               ::operator*(&it_end);
      local_60.scm_value = psVar2->scm_value;
      local_68.scm_value = *(uint64_t *)this;
      make_pair((skiwi *)local_58,&local_60,&local_68);
      *(uint64_t *)this = local_58[0].scm_value;
      scm_type::~scm_type(local_58);
      scm_type::~scm_type(&local_68);
      scm_type::~scm_type(&local_60);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_skiwi::scm_type_*,_std::vector<skiwi::scm_type,_std::allocator<skiwi::scm_type>_>_>_>
      ::operator++(&it_end);
    }
  }
  return (scm_type)(uint64_t)this;
}

Assistant:

scm_type make_list(const std::vector<scm_type>& lst)
  {
  if (lst.empty())
    return make_nil();
  auto it = lst.rbegin();
  auto it_end = lst.rend();
  scm_type out = make_pair(*it, make_nil());
  ++it;
  while (it != it_end)
    {
    out = make_pair(*it, out);
    ++it;
    }
  return out;
  }